

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_core.cpp
# Opt level: O2

void __thiscall
so_5::impl::layer_core_t::add_extra_layer(layer_core_t *this,type_index *type,layer_ref_t *layer)

{
  typed_layer_ref_t *ptVar1;
  const_iterator cVar2;
  __normal_iterator<so_5::impl::typed_layer_ref_t_*,_std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>_>
  __position;
  typed_layer_ref_t typed_layer;
  allocator local_50 [32];
  
  if ((layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string
              ((string *)&typed_layer,"trying to add nullptr extra layer",local_50);
    exception_t::raise(0x283bf3);
    std::__cxx11::string::~string((string *)&typed_layer);
  }
  ptVar1 = (this->m_default_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cVar2 = search_for_layer(&this->m_default_layers,type);
  if (ptVar1 != cVar2._M_current) {
    std::__cxx11::string::string
              ((string *)&typed_layer,
               "trying to add extra layer that already exists in default list",local_50);
    exception_t::raise(0x283bf3);
    std::__cxx11::string::~string((string *)&typed_layer);
  }
  std::mutex::lock(&this->m_extra_layers_lock);
  ptVar1 = (this->m_extra_layers).
           super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  cVar2 = search_for_layer(&this->m_extra_layers,type);
  if (ptVar1 != cVar2._M_current) {
    std::__cxx11::string::string
              ((string *)&typed_layer,"trying to add extra layer that already exists in extra list",
               local_50);
    exception_t::raise(0x283bf3);
    std::__cxx11::string::~string((string *)&typed_layer);
  }
  layer_t::bind_to_environment
            ((layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
             this->m_env);
  (*((layer->super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_layer_t
    [2])();
  typed_layer_ref_t::typed_layer_ref_t(&typed_layer,type,layer);
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<so_5::impl::typed_layer_ref_t*,std::vector<so_5::impl::typed_layer_ref_t,std::allocator<so_5::impl::typed_layer_ref_t>>>,so_5::impl::typed_layer_ref_t,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->m_extra_layers).
                          super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->m_extra_layers).
                          super__Vector_base<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&typed_layer);
  std::vector<so_5::impl::typed_layer_ref_t,_std::allocator<so_5::impl::typed_layer_ref_t>_>::insert
            (&this->m_extra_layers,(const_iterator)__position._M_current,&typed_layer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&typed_layer.m_layer.super___shared_ptr<so_5::layer_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_extra_layers_lock);
  return;
}

Assistant:

void
layer_core_t::add_extra_layer(
	const std::type_index & type,
	const layer_ref_t & layer )
{
	if( nullptr == layer.get() )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_nullptr_extra_layer,
			"trying to add nullptr extra layer" );

	if( m_default_layers.end() != search_for_layer( m_default_layers, type ) )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_extra_layer_that_already_exists_in_default_list,
			"trying to add extra layer that already exists in default list" );

	std::lock_guard< std::mutex > lock( m_extra_layers_lock );

	if( m_extra_layers.end() != search_for_layer( m_extra_layers, type ) )
		SO_5_THROW_EXCEPTION(
			rc_trying_to_add_extra_layer_that_already_exists_in_extra_list,
			"trying to add extra layer that already exists in extra list" );

	layer->bind_to_environment( &m_env );

	try
	{
		layer->start();
	}
	catch( const std::exception & x )
	{
		SO_5_THROW_EXCEPTION(
			rc_unable_to_start_extra_layer,
			std::string( "layer raised an exception: " ) + x.what() );
	}

	try
	{
		typed_layer_ref_t typed_layer( type, layer );

		m_extra_layers.insert(
			std::lower_bound(
				m_extra_layers.begin(),
				m_extra_layers.end(),
				typed_layer ),
			typed_layer );
	}
	catch( const std::exception & x )
	{
		// Unable to store layer. Layer must be stopped...
		layer->shutdown();
		layer->wait();

		// ...And error must be reported.
		SO_5_THROW_EXCEPTION(
			rc_unable_to_start_extra_layer,
			std::string( "unable to store pointer to layer, exception: " ) +
				x.what() );
	}
}